

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O3

void __thiscall Liby::Socket::createSocket(Socket *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  FileDescriptor *pFVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  int iVar3;
  int *piVar4;
  undefined8 *puVar5;
  char *pcVar6;
  undefined1 local_29;
  FileDescriptor *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_20 [2];
  
  iVar3 = socket(2,this->isUdp_ + 1,0);
  this->fd_ = iVar3;
  if (-1 < iVar3) {
    local_28 = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Liby::FileDescriptor,std::allocator<Liby::FileDescriptor>,int&>
              (a_Stack_20,&local_28,(allocator<Liby::FileDescriptor> *)&local_29,&this->fd_);
    _Var2._M_pi = a_Stack_20[0]._M_pi;
    pFVar1 = local_28;
    local_28 = (FileDescriptor *)0x0;
    a_Stack_20[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = (this->fp_).super___shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    (this->fp_).super___shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pFVar1
    ;
    (this->fp_).super___shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = _Var2._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      if (a_Stack_20[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_20[0]._M_pi);
      }
    }
    return;
  }
  piVar4 = __errno_location();
  puVar5 = (undefined8 *)__cxa_allocate_exception(8);
  pcVar6 = strerror(*piVar4);
  *puVar5 = pcVar6;
  __cxa_throw(puVar5,&char*::typeinfo,0);
}

Assistant:

void Socket::createSocket() {
    fd_ = ::socket(AF_INET, isUdp_ ? SOCK_DGRAM : SOCK_STREAM, 0);
    if (fd_ < 0) {
        throw_err();
    }

    fp_ = std::make_shared<FileDescriptor>(fd_);
}